

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::cdf(extreme_value_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  
  fVar1 = expf((x - (this->P).eta_) / (this->P).theta_);
  fVar1 = expf(-fVar1);
  return 1.0 - fVar1;
}

Assistant:

cdf(result_type x) const {
      x -= P.eta();
      x /= P.theta();
      return 1 - math::exp(-math::exp(x));
    }